

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templates.h
# Opt level: O0

double compute_area<2ul,std::tuple<Point<double>,Point<double>,Point<double>,Point<double>,Point<double>>>
                 (tuple<Point<double>,_Point<double>,_Point<double>,_Point<double>,_Point<double>_>
                  *tuple)

{
  tuple<Point<double>,_Point<double>,_Point<double>,_Point<double>,_Point<double>_> *ptVar1;
  double extraout_XMM0_Qa;
  double dVar2;
  double local_area;
  double dy2;
  double dx2;
  double dy1;
  double dx1;
  tuple<Point<double>,_Point<double>,_Point<double>,_Point<double>,_Point<double>_> *tuple_local;
  
  std::get<2ul,Point<double>,Point<double>,Point<double>,Point<double>,Point<double>>(tuple);
  std::get<0ul,Point<double>,Point<double>,Point<double>,Point<double>,Point<double>>(tuple);
  std::get<2ul,Point<double>,Point<double>,Point<double>,Point<double>,Point<double>>(tuple);
  std::get<0ul,Point<double>,Point<double>,Point<double>,Point<double>,Point<double>>(tuple);
  std::get<1ul,Point<double>,Point<double>,Point<double>,Point<double>,Point<double>>(tuple);
  std::get<0ul,Point<double>,Point<double>,Point<double>,Point<double>,Point<double>>(tuple);
  std::get<1ul,Point<double>,Point<double>,Point<double>,Point<double>,Point<double>>(tuple);
  ptVar1 = tuple;
  std::get<0ul,Point<double>,Point<double>,Point<double>,Point<double>,Point<double>>(tuple);
  std::abs((int)ptVar1);
  dVar2 = compute_area<3ul,std::tuple<Point<double>,Point<double>,Point<double>,Point<double>,Point<double>>>
                    (tuple);
  return extraout_XMM0_Qa * 0.5 + dVar2;
}

Assistant:

double compute_area(const T& tuple) {
    if constexpr (Id >= std::tuple_size_v<T>){
        return 0;
    }else{
        const auto dx1 = std::get<Id - 0>(tuple).x - std::get<0>(tuple).x;
        const auto dy1 = std::get<Id - 0>(tuple).y - std::get<0>(tuple).y;
        const auto dx2 = std::get<Id - 1>(tuple).x - std::get<0>(tuple).x;
        const auto dy2 = std::get<Id - 1>(tuple).y - std::get<0>(tuple).y;
        const double local_area = std::abs(dx1 * dy2 - dy1 * dx2) * 0.5;
        return local_area + compute_area<Id + 1>(tuple);
    }
}